

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void do_room_or_subroom(level *lev,mkroom *croom,int lowx,int lowy,int hix,int hiy,boolean lit,
                       schar rtype,boolean special,boolean is_room)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int y1;
  int x2;
  int x1;
  undefined1 *puVar5;
  schar *psVar6;
  int y2;
  schar sVar7;
  schar *psVar8;
  undefined1 *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  x1 = lowx + (uint)(lowx == 0);
  y1 = lowy + (uint)(lowy == 0);
  x2 = 0x4e;
  if (hix < 0x4e) {
    x2 = hix;
  }
  y2 = 0x13;
  if (hiy < 0x13) {
    y2 = hiy;
  }
  if (lit == '\0') {
    sVar7 = '\0';
  }
  else {
    sVar7 = '\x01';
    if (x1 + -1 <= x2 + 1) {
      uVar1 = y1 - 1;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = uVar1;
      }
      lVar12 = (long)(x1 + -1);
      puVar9 = &lev->locations[lVar12][uVar2].field_0x6;
      do {
        puVar5 = puVar9;
        iVar10 = (y2 - y1) + 3;
        if ((int)uVar1 <= y2 + 1) {
          do {
            puVar5[1] = puVar5[1] | 4;
            iVar10 = iVar10 + -1;
            puVar5 = puVar5 + 0xc;
          } while (iVar10 != 0);
        }
        lVar12 = lVar12 + 1;
        puVar9 = puVar9 + 0xfc;
      } while (x2 + 2 != (int)lVar12);
    }
  }
  croom->rlit = sVar7;
  croom->lx = (schar)x1;
  croom->hx = (schar)x2;
  croom->ly = (schar)y1;
  croom->hy = (schar)y2;
  croom->rtype = rtype;
  croom->doorct = '\0';
  croom->fdoor = (schar)lev->doorindex;
  croom->nsubrooms = '\0';
  croom->irregular = '\0';
  croom->sbrooms[0] = (mkroom *)0x0;
  if (special == '\0') {
    iVar10 = x1 + -1;
    iVar3 = x2 + 1;
    if (iVar10 <= iVar3) {
      lVar12 = (long)iVar10;
      iVar4 = y1 + -1;
      lVar13 = (long)((y2 - y1) + 2);
      puVar9 = &lev->locations[lVar12][iVar4].field_0x6;
      do {
        puVar5 = puVar9;
        lVar11 = (long)iVar4;
        if (iVar4 <= y2 + 1) {
          do {
            puVar5[-2] = '\x02';
            puVar5[1] = puVar5[1] | 2;
            lVar11 = lVar11 + lVar13;
            puVar5 = puVar5 + lVar13 * 0xc;
          } while (lVar11 <= y2 + 1);
        }
        lVar12 = lVar12 + 1;
        puVar9 = puVar9 + 0xfc;
      } while (x2 + 2 != (int)lVar12);
    }
    lVar12 = (long)iVar3;
    if (iVar10 <= iVar3) {
      lVar13 = (long)iVar10;
      lVar11 = (long)((x2 - x1) + 2);
      puVar9 = &lev->locations[lVar13][y1].field_0x6;
      do {
        puVar5 = puVar9;
        iVar4 = (y2 - y1) + 1;
        if (y1 <= y2) {
          do {
            puVar5[-2] = '\x01';
            puVar5[1] = puVar5[1] & 0xfd;
            puVar5 = puVar5 + 0xc;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        lVar13 = lVar13 + lVar11;
        puVar9 = puVar9 + lVar11 * 0xfc;
      } while (lVar13 <= lVar12);
    }
    if (x1 <= x2) {
      lVar13 = (long)x1;
      psVar8 = &lev->locations[lVar13][y1].typ;
      do {
        psVar6 = psVar8;
        iVar4 = (y2 - y1) + 1;
        if (y1 <= y2) {
          do {
            *psVar6 = '\x19';
            iVar4 = iVar4 + -1;
            psVar6 = psVar6 + 0xc;
          } while (iVar4 != 0);
        }
        lVar13 = lVar13 + 1;
        psVar8 = psVar8 + 0xfc;
      } while (iVar3 != (int)lVar13);
    }
    if (is_room != '\0') {
      y1 = y1 + -1;
      lev->locations[iVar10][y1].typ = '\x03';
      lev->locations[lVar12][y1].typ = '\x04';
      y2 = y2 + 1;
      lev->locations[iVar10][y2].typ = '\x05';
      lev->locations[lVar12][y2].typ = '\x06';
      x1 = iVar10;
      x2 = iVar3;
    }
    wallification(lev,x1,y1,x2,y2);
    return;
  }
  return;
}

Assistant:

static void do_room_or_subroom(struct level *lev,
			       struct mkroom *croom,
			       int lowx, int lowy,
			       int hix, int hiy,
			       boolean lit,
			       schar rtype,
			       boolean special,
			       boolean is_room)
{
	int x, y;
	struct rm *loc;

	/* locations might bump level edges in wall-less rooms */
	/* add/subtract 1 to allow for edge locations */
	if (!lowx) lowx++;
	if (!lowy) lowy++;
	if (hix >= COLNO-1) hix = COLNO-2;
	if (hiy >= ROWNO-1) hiy = ROWNO-2;

	if (lit) {
		for (x = lowx-1; x <= hix+1; x++) {
			loc = &lev->locations[x][max(lowy-1,0)];
			for (y = lowy-1; y <= hiy+1; y++)
				loc++->lit = 1;
		}
		croom->rlit = 1;
	} else
		croom->rlit = 0;

	croom->lx = lowx;
	croom->hx = hix;
	croom->ly = lowy;
	croom->hy = hiy;
	croom->rtype = rtype;
	croom->doorct = 0;
	/* if we're not making a vault, lev->doorindex will still be 0
	 * if we are, we'll have problems adding niches to the previous room
	 * unless fdoor is at least doorindex
	 */
	croom->fdoor = lev->doorindex;
	croom->irregular = FALSE;

	croom->nsubrooms = 0;
	croom->sbrooms[0] = NULL;
	if (!special) {
	    for (x = lowx-1; x <= hix+1; x++)
		for (y = lowy-1; y <= hiy+1; y += (hiy-lowy+2)) {
		    lev->locations[x][y].typ = HWALL;
		    lev->locations[x][y].horizontal = 1;	/* For open/secret doors. */
		}
	    for (x = lowx-1; x <= hix+1; x += (hix-lowx+2))
		for (y = lowy; y <= hiy; y++) {
		    lev->locations[x][y].typ = VWALL;
		    lev->locations[x][y].horizontal = 0;	/* For open/secret doors. */
		}
	    for (x = lowx; x <= hix; x++) {
		loc = &lev->locations[x][lowy];
		for (y = lowy; y <= hiy; y++)
		    loc++->typ = ROOM;
	    }
	    if (is_room) {
		lev->locations[lowx-1][lowy-1].typ = TLCORNER;
		lev->locations[hix+1][lowy-1].typ = TRCORNER;
		lev->locations[lowx-1][hiy+1].typ = BLCORNER;
		lev->locations[hix+1][hiy+1].typ = BRCORNER;
		wallification(lev, lowx-1, lowy-1, hix+1, hiy+1);
	    } else {	/* a subroom */
		wallification(lev, lowx, lowy, hix, hiy);	/* this is bugs */
	    }
	}
}